

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O2

int SetCurrentLabelEx(char *szFilePath,int CurLbl)

{
  int iVar1;
  FILE *__stream;
  char *__s;
  
  __stream = fopen(szFilePath,"w");
  if (__stream == (FILE *)0x0) {
    __s = "Unable to create current label file.";
  }
  else {
    iVar1 = fprintf(__stream,"%d",CurLbl);
    if (iVar1 < 1) {
      puts("Error writing current label file.");
      fclose(__stream);
      return 1;
    }
    iVar1 = fclose(__stream);
    if (iVar1 == 0) {
      return 0;
    }
    __s = "Error closing current label file.";
  }
  puts(__s);
  return 1;
}

Assistant:

inline int SetCurrentLabelEx(char* szFilePath, int CurLbl)
{

	// Should use an interprocess semaphore...

	FILE* file = NULL;

	file = fopen(szFilePath, "w");
	if (file == NULL)
	{
		printf("Unable to create current label file.\n");
		return EXIT_FAILURE;
	}
	if (fprintf(file, "%d", CurLbl) <= 0)
	{
		printf("Error writing current label file.\n");
		fclose(file);
		return EXIT_FAILURE;
	}
	if (fclose(file) != EXIT_SUCCESS) 
	{
		printf("Error closing current label file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}